

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastRotateRight(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,Vec_Int_t *vRes)

{
  int *piVar1;
  int iVar2;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  vRes->nSize = 0;
  uVar4 = (ulong)(uint)nNum;
  if (0 < nNum) {
    uVar3 = 0;
    do {
      Vec_IntPush(vRes,pNum[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  __ptr = malloc((long)nNum << 2);
  if (0x20 < nShift) {
    __assert_fail("nShift <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0xc2,
                  "void Wlc_BlastRotateRight(Gia_Man_t *, int *, int, int *, int, Vec_Int_t *)");
  }
  if (0 < nShift) {
    uVar3 = 0;
    do {
      if (nNum < 1) {
        vRes->nSize = 0;
      }
      else {
        piVar1 = vRes->pArray;
        uVar5 = 0;
        do {
          iVar2 = Gia_ManHashMux(pNew,pShift[uVar3],
                                 piVar1[((1 << ((byte)uVar3 & 0x1f)) + (int)uVar5) % nNum],
                                 piVar1[uVar5]);
          *(int *)((long)__ptr + uVar5 * 4) = iVar2;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
        vRes->nSize = 0;
        if (0 < nNum) {
          uVar5 = 0;
          do {
            Vec_IntPush(vRes,*(int *)((long)__ptr + uVar5 * 4));
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)nShift);
  }
  if (__ptr == (void *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Wlc_BlastRotateRight( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, Vec_Int_t * vRes )
{
    int * pRes = Wlc_VecCopy( vRes, pNum, nNum );
    int i, j, * pTemp = ABC_ALLOC( int, nNum );
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++, pRes = Wlc_VecCopy(vRes, pTemp, nNum) ) 
        for( j = 0; j < nNum; j++ ) 
            pTemp[j] = Gia_ManHashMux( pNew, pShift[i], pRes[(j+(1<<i))%nNum], pRes[j] );
    ABC_FREE( pTemp );
}